

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf-hash.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  char cVar2;
  char cVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  XXH_errorcode XVar12;
  uint uVar13;
  hash_manifest_result_t hVar14;
  istream *piVar15;
  XXH64_state_t *statePtr;
  undefined8 uVar16;
  undefined8 uVar17;
  long lVar18;
  long *plVar19;
  XXH64_hash_t XVar20;
  undefined1 *extraout_RAX;
  undefined1 *puVar21;
  undefined7 uVar23;
  uchar *extraout_RAX_00;
  char *extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  ulong extraout_RAX_07;
  ulong extraout_RAX_08;
  ulong extraout_RAX_09;
  invalid_argument *piVar22;
  size_type *psVar24;
  size_type sVar25;
  char *pcVar26;
  string *psVar27;
  byte bVar28;
  uint uVar29;
  ulong uVar30;
  byte *pbVar31;
  uchar *puVar32;
  uint shift_bits_by;
  uint shift_bits_by_1;
  size_t sVar33;
  int iVar34;
  char local_58c [4];
  undefined8 local_588;
  uint local_57c;
  undefined8 local_578;
  uint local_56c;
  char hex_result [17];
  undefined2 uStack_554;
  undefined1 uStack_552;
  undefined1 uStack_551;
  uchar result_1 [32];
  string tensor_layer_name;
  hash_params params;
  uchar uuidv5_namespace [16];
  undefined1 local_4a8 [17];
  undefined4 uStack_497;
  undefined4 uStack_493;
  undefined7 uStack_48f;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined1 local_478;
  undefined8 local_468;
  XXH64_state_t *local_460;
  ggml_context *ctx_data;
  ulong local_450;
  char result [21];
  string manifest_entry_line;
  string arg;
  string arg_prefix;
  ios_base local_138 [264];
  
  params.input._M_dataplus._M_p = (pointer)&params.input.field_2;
  params.input._M_string_length = 0;
  params.input.field_2._M_local_buf[0] = '\0';
  params.manifest_file._M_dataplus._M_p = (pointer)&params.manifest_file.field_2;
  params.xxh64 = false;
  params.sha1 = false;
  params.sha256 = false;
  params.uuid = false;
  params.no_layer = false;
  params.manifest_is_usable = false;
  params.manifest_file._M_string_length = 0;
  params.manifest_file.field_2._M_local_buf[0] = '\0';
  local_58c[2] = '\0';
  local_58c[1] = 0;
  local_58c[3] = '\0';
  local_58c[0] = '\0';
  arg._M_dataplus._M_p = (pointer)&arg.field_2;
  arg._M_string_length = 0;
  arg.field_2._M_local_buf[0] = '\0';
  arg_prefix._M_dataplus._M_p = (pointer)&arg_prefix.field_2;
  arg_prefix.field_2._M_allocated_capacity._0_2_ = 0x2d2d;
  arg_prefix._M_string_length = 2;
  arg_prefix.field_2._M_local_buf[2] = '\0';
  iVar34 = 1;
  if (1 < argc) {
    do {
      sVar25 = arg._M_string_length;
      pcVar26 = argv[iVar34];
      if ((*pcVar26 != '-') || (pcVar26[1] != '-')) break;
      strlen(pcVar26);
      std::__cxx11::string::_M_replace((ulong)&arg,0,(char *)sVar25,(ulong)pcVar26);
      iVar5 = std::__cxx11::string::compare((ulong)&arg,0,(string *)arg_prefix._M_string_length);
      if ((iVar5 == 0) && (arg._M_string_length != 0)) {
        sVar25 = 0;
        do {
          if (arg._M_dataplus._M_p[sVar25] == '_') {
            arg._M_dataplus._M_p[sVar25] = '-';
          }
          sVar25 = sVar25 + 1;
        } while (arg._M_string_length != sVar25);
      }
      iVar5 = std::__cxx11::string::compare((char *)&arg);
      if ((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)&arg), iVar5 == 0)) {
        hash_print_usage(*argv);
        exit(0);
      }
      iVar5 = std::__cxx11::string::compare((char *)&arg);
      if (iVar5 == 0) {
        params.xxh64 = true;
      }
      iVar6 = std::__cxx11::string::compare((char *)&arg);
      if (iVar6 == 0) {
        params.sha1 = true;
      }
      iVar7 = std::__cxx11::string::compare((char *)&arg);
      if (iVar7 == 0) {
        params.uuid = true;
      }
      iVar8 = std::__cxx11::string::compare((char *)&arg);
      if (iVar8 == 0) {
        params.sha256 = true;
      }
      iVar9 = std::__cxx11::string::compare((char *)&arg);
      if (iVar9 == 0) {
        params.xxh64 = false;
        params.sha1 = false;
        params.sha256 = true;
        params.xxh64 = true;
        params.sha1 = true;
      }
      iVar10 = std::__cxx11::string::compare((char *)&arg);
      if (iVar10 == 0) {
        params.no_layer = true;
      }
      iVar11 = std::__cxx11::string::compare((char *)&arg);
      if ((iVar11 == 0) || (iVar11 = std::__cxx11::string::compare((char *)&arg), iVar11 == 0)) {
        sVar25 = params.manifest_file._M_string_length;
        iVar34 = iVar34 + 1;
        if (argc <= iVar34) {
          piVar22 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::operator+(&manifest_entry_line,"error: invalid parameter for argument:",&arg);
          std::invalid_argument::invalid_argument(piVar22,(string *)&manifest_entry_line);
          __cxa_throw(piVar22,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        pcVar26 = argv[iVar34];
        strlen(pcVar26);
        std::__cxx11::string::_M_replace
                  ((ulong)&params.manifest_file,0,(char *)sVar25,(ulong)pcVar26);
      }
      else if (iVar10 != 0 &&
               (iVar9 != 0 && (iVar8 != 0 && (iVar7 != 0 && (iVar6 != 0 && iVar5 != 0))))) {
        piVar22 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::operator+(&manifest_entry_line,"error: unknown argument: ",&arg);
        std::invalid_argument::invalid_argument(piVar22,(string *)&manifest_entry_line);
        __cxa_throw(piVar22,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      iVar34 = iVar34 + 1;
    } while (iVar34 < argc);
  }
  sVar25 = params.input._M_string_length;
  if (argc <= iVar34) {
    piVar22 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar22,"error: bad arguments");
    __cxa_throw(piVar22,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pcVar26 = argv[iVar34];
  strlen(pcVar26);
  std::__cxx11::string::_M_replace((ulong)&params,0,(char *)sVar25,(ulong)pcVar26);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)arg_prefix._M_dataplus._M_p != &arg_prefix.field_2) {
    operator_delete(arg_prefix._M_dataplus._M_p,
                    CONCAT53(arg_prefix.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(arg_prefix.field_2._M_local_buf[2],
                                      arg_prefix.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)arg._M_dataplus._M_p != &arg.field_2) {
    operator_delete(arg._M_dataplus._M_p,
                    CONCAT71(arg.field_2._M_allocated_capacity._1_7_,arg.field_2._M_local_buf[0]) +
                    1);
  }
  if (params.manifest_file._M_string_length == 0) {
    bVar4 = params.xxh64;
  }
  else {
    std::ifstream::ifstream(&arg,(string *)&params.manifest_file,_S_in);
    cVar3 = std::__basic_file<char>::is_open();
    if (cVar3 == '\0') {
      std::ifstream::~ifstream(&arg);
      printf("ERROR cannot open manifest %s",params.manifest_file._M_dataplus._M_p);
      uVar13 = 5;
      goto LAB_00103b69;
    }
    manifest_entry_line._M_dataplus._M_p = (pointer)&manifest_entry_line.field_2;
    manifest_entry_line._M_string_length = 0;
    manifest_entry_line.field_2._M_local_buf[0] = '\0';
    while( true ) {
      cVar3 = std::ios::widen((char)*(undefined8 *)(arg._M_dataplus._M_p + -0x18) + (char)&arg);
      piVar15 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)&arg,(string *)&manifest_entry_line,cVar3);
      if (((byte)piVar15[*(long *)(*(long *)piVar15 + -0x18) + 0x20] & 5) != 0) break;
      std::__cxx11::istringstream::istringstream
                ((istringstream *)&arg_prefix,(string *)&manifest_entry_line,_S_in);
      uuidv5_namespace[8] = '\0';
      uuidv5_namespace[9] = '\0';
      uuidv5_namespace[10] = '\0';
      uuidv5_namespace[0xb] = '\0';
      uuidv5_namespace[0xc] = '\0';
      uuidv5_namespace[0xd] = '\0';
      uuidv5_namespace[0xe] = '\0';
      uuidv5_namespace[0xf] = '\0';
      local_4a8._0_8_ = local_4a8._0_8_ & 0xffffffffffffff00;
      uuidv5_namespace._0_8_ = local_4a8;
      piVar15 = std::operator>>((istream *)&arg_prefix,(string *)uuidv5_namespace);
      if (((byte)piVar15[*(long *)(*(long *)piVar15 + -0x18) + 0x20] & 5) == 0) {
        iVar34 = std::__cxx11::string::compare((char *)uuidv5_namespace);
        pcVar26 = local_58c + 3;
        if (iVar34 != 0) {
          iVar34 = std::__cxx11::string::compare((char *)uuidv5_namespace);
          pcVar26 = local_58c + 1;
          if (iVar34 != 0) {
            iVar34 = std::__cxx11::string::compare((char *)uuidv5_namespace);
            pcVar26 = local_58c + 2;
            if (iVar34 != 0) {
              iVar34 = std::__cxx11::string::compare((char *)uuidv5_namespace);
              pcVar26 = local_58c;
              if (iVar34 != 0) goto LAB_001028b7;
            }
          }
        }
        *pcVar26 = '\x01';
      }
LAB_001028b7:
      if ((undefined1 *)uuidv5_namespace._0_8_ != local_4a8) {
        operator_delete((void *)uuidv5_namespace._0_8_,local_4a8._0_8_ + 1);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)&arg_prefix);
      std::ios_base::~ios_base(local_138);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)manifest_entry_line._M_dataplus._M_p != &manifest_entry_line.field_2) {
      operator_delete(manifest_entry_line._M_dataplus._M_p,
                      CONCAT71(manifest_entry_line.field_2._M_allocated_capacity._1_7_,
                               manifest_entry_line.field_2._M_local_buf[0]) + 1);
    }
    std::ifstream::~ifstream(&arg);
    cVar3 = local_58c[3];
    bVar28 = local_58c[1];
    if (local_58c[3] == '\0') {
      if (((local_58c[1] == 0) && (local_58c[2] == '\0')) && (local_58c[0] == '\0')) {
        printf("ERROR manifest does not have any known hash format in %s",
               params.manifest_file._M_dataplus._M_p);
        uVar13 = 4;
        goto LAB_00103b69;
      }
      printf("manifest  %s");
    }
    else {
      printf("manifest  %s");
      printf("  sha256");
      bVar28 = local_58c[1];
    }
    if ((bVar28 & 1) != 0) {
      printf("  sha1");
    }
    cVar2 = local_58c[2];
    if (local_58c[2] == '\x01') {
      printf("  xxh64");
    }
    cVar1 = local_58c[0];
    if (local_58c[0] == '\x01') {
      printf("  uuid");
    }
    putchar(10);
    bVar4 = params.xxh64;
    if (((params.xxh64 == false) && (params.sha1 == false)) &&
       ((params.uuid == false && (params.sha256 == false)))) {
      if (cVar3 == '\0') {
        if ((bVar28 & 1) == 0) {
          if (cVar2 == '\0') {
            if (cVar1 != '\0') {
              params.uuid = true;
            }
          }
          else {
            params.xxh64 = true;
            bVar4 = 1;
          }
        }
        else {
          params.xxh64 = false;
          params.sha1 = true;
        }
      }
      else {
        params.sha256 = true;
        params.uuid = false;
      }
    }
    params.manifest_is_usable = true;
  }
  if ((((bVar4 & 1) == 0) && (params.sha1 == false)) &&
     ((params.uuid == false && (params.sha256 == false)))) {
    params.xxh64 = true;
LAB_00102ad4:
    ctx_data = (ggml_context *)0x0;
    statePtr = XXH64_createState();
    if (statePtr == (XXH64_state_t *)0x0) {
      abort();
    }
    XVar12 = XXH64_reset(statePtr,0);
    if (XVar12 == XXH_ERROR) {
      abort();
    }
  }
  else {
    ctx_data = (ggml_context *)0x0;
    if ((bVar4 & 1) != 0) goto LAB_00102ad4;
    statePtr = (XXH64_state_t *)0x0;
  }
  if (params.sha1 == true) {
    SHA1Init((SHA1_CTX *)&arg_prefix);
  }
  if (params.sha256 == true) {
    sha256_init((sha256_t *)&arg);
  }
  if (params.uuid == true) {
    uuidv5_namespace[0] = 0xef;
    uuidv5_namespace[1] = '\0';
    uuidv5_namespace[2] = '\x12';
    uuidv5_namespace[3] = '\x06';
    uuidv5_namespace[4] = 0xda;
    uuidv5_namespace[5] = 0xdc;
    uuidv5_namespace[6] = '_';
    uuidv5_namespace[7] = 'm';
    uuidv5_namespace[8] = 0xa1;
    uuidv5_namespace[9] = '_';
    uuidv5_namespace[10] = '3';
    uuidv5_namespace[0xb] = 'Y';
    uuidv5_namespace[0xc] = 0xe5;
    uuidv5_namespace[0xd] = 'w';
    uuidv5_namespace[0xe] = 0xd4;
    uuidv5_namespace[0xf] = 0xe5;
    SHA1Init((SHA1_CTX *)&manifest_entry_line);
    SHA1Update((SHA1_CTX *)&manifest_entry_line,uuidv5_namespace,0x10);
  }
  uVar16 = gguf_init_from_file(params.input._M_dataplus._M_p,0,&ctx_data);
  uVar13 = gguf_get_n_tensors(uVar16);
  local_468 = uVar16;
  local_460 = statePtr;
  if ((int)uVar13 < 1) {
    local_56c = 0;
    local_57c = 0;
  }
  else {
    uVar30 = 0;
    local_57c = 0;
    local_56c = 0;
    do {
      local_450 = uVar30;
      uVar17 = gguf_get_tensor_name(uVar16);
      lVar18 = ggml_get_tensor(ctx_data,uVar17);
      local_588 = (uchar *)ggml_nbytes(lVar18);
      local_578 = *(uchar **)(lVar18 + 0xf8);
      uuidv5_namespace._0_8_ = local_4a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)uuidv5_namespace,params.input._M_dataplus._M_p,
                 params.input._M_dataplus._M_p + params.input._M_string_length);
      std::__cxx11::string::append((char *)uuidv5_namespace);
      plVar19 = (long *)std::__cxx11::string::append((char *)uuidv5_namespace);
      tensor_layer_name._M_dataplus._M_p = (pointer)&tensor_layer_name.field_2;
      psVar24 = (size_type *)(plVar19 + 2);
      if ((size_type *)*plVar19 == psVar24) {
        tensor_layer_name.field_2._M_allocated_capacity = *psVar24;
        tensor_layer_name.field_2._8_8_ = plVar19[3];
      }
      else {
        tensor_layer_name.field_2._M_allocated_capacity = *psVar24;
        tensor_layer_name._M_dataplus._M_p = (pointer)*plVar19;
      }
      tensor_layer_name._M_string_length = plVar19[1];
      *plVar19 = (long)psVar24;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      if ((undefined1 *)uuidv5_namespace._0_8_ != local_4a8) {
        operator_delete((void *)uuidv5_namespace._0_8_,local_4a8._0_8_ + 1);
      }
      if (params.xxh64 == true) {
        if (params.no_layer == false) {
          XVar20 = XXH64(local_578,(size_t)local_588,0);
          lVar18 = 0x38;
          sVar33 = 0x11;
          pcVar26 = hex_result;
          do {
            snprintf(pcVar26,sVar33,"%02x",XVar20 >> ((byte)lVar18 & 0x3f) & 0xff);
            lVar18 = lVar18 + -8;
            sVar33 = sVar33 - 2;
            pcVar26 = pcVar26 + 2;
          } while (lVar18 != -8);
          if (params.manifest_is_usable == false) {
            printf("%-8s  %-s  %s\n","xxh64",hex_result,tensor_layer_name._M_dataplus._M_p);
            uVar16 = local_468;
          }
          else {
            uuidv5_namespace._0_8_ = local_4a8;
            uuidv5_namespace[8] = '\x05';
            uuidv5_namespace[9] = '\0';
            uuidv5_namespace[10] = '\0';
            uuidv5_namespace[0xb] = '\0';
            uuidv5_namespace[0xc] = '\0';
            uuidv5_namespace[0xd] = '\0';
            uuidv5_namespace[0xe] = '\0';
            uuidv5_namespace[0xf] = '\0';
            local_4a8._0_6_ = 0x3436687878;
            result_1._0_8_ = result_1 + 0x10;
            sVar33 = strlen(hex_result);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)result_1,hex_result,hex_result + sVar33);
            uVar16 = local_468;
            hVar14 = manifest_verify(&params.manifest_file,(string *)uuidv5_namespace,
                                     (string *)result_1,&tensor_layer_name);
            if ((uchar *)result_1._0_8_ != result_1 + 0x10) {
              operator_delete((void *)result_1._0_8_,
                              CONCAT17(result_1[0x17],
                                       CONCAT16(result_1[0x16],
                                                CONCAT15(result_1[0x15],
                                                         CONCAT14(result_1[0x14],result_1._16_4_))))
                              + 1);
            }
            puVar21 = local_4a8;
            if ((undefined1 *)uuidv5_namespace._0_8_ != puVar21) {
              operator_delete((void *)uuidv5_namespace._0_8_,local_4a8._0_8_ + 1);
              puVar21 = extraout_RAX;
            }
            uVar23 = (undefined7)((ulong)puVar21 >> 8);
            if (hVar14 == HASH_MANIFEST_MISMATCH) {
              local_57c = (uint)CONCAT71(uVar23,1);
              local_56c = (uint)CONCAT71(uVar23,1);
              pcVar26 = "Mismatch";
            }
            else if (hVar14 == HASH_MANIFEST_OK) {
              local_57c = (uint)CONCAT71(uVar23,1);
              pcVar26 = "Ok";
            }
            else {
              pcVar26 = "?";
              if (hVar14 == HASH_MANIFEST_NOT_FOUND) {
                pcVar26 = "Not Found";
              }
            }
            printf("%-8s  %-s  %s  -  %s\n","xxh64",hex_result,tensor_layer_name._M_dataplus._M_p,
                   pcVar26);
          }
        }
        XVar12 = XXH64_update(local_460,local_578,(size_t)local_588);
        if (XVar12 == XXH_ERROR) {
          abort();
        }
      }
      if (params.sha1 == true) {
        if (params.no_layer != true) {
          pbVar31 = (byte *)result;
          SHA1(pbVar31,(size_t)local_578,local_588);
          uStack_497 = 0;
          uStack_493 = 0;
          local_4a8._0_8_ = 0;
          local_4a8[8] = '\0';
          local_4a8._9_4_ = 0;
          local_4a8._13_4_ = 0;
          uuidv5_namespace[0] = '\0';
          uuidv5_namespace[1] = '\0';
          uuidv5_namespace[2] = '\0';
          uuidv5_namespace[3] = '\0';
          uuidv5_namespace[4] = '\0';
          uuidv5_namespace[5] = '\0';
          uuidv5_namespace[6] = '\0';
          uuidv5_namespace[7] = '\0';
          uuidv5_namespace[8] = '\0';
          uuidv5_namespace[9] = '\0';
          uuidv5_namespace[10] = '\0';
          uuidv5_namespace[0xb] = '\0';
          uuidv5_namespace[0xc] = '\0';
          uuidv5_namespace[0xd] = '\0';
          uuidv5_namespace[0xe] = '\0';
          uuidv5_namespace[0xf] = '\0';
          sVar33 = 0x29;
          psVar27 = (string *)uuidv5_namespace;
          do {
            snprintf((char *)psVar27,sVar33,"%02x",(ulong)*pbVar31);
            sVar33 = sVar33 - 2;
            pbVar31 = pbVar31 + 1;
            psVar27 = (string *)((long)&(psVar27->_M_dataplus)._M_p + 2);
          } while (sVar33 != 1);
          if (params.manifest_is_usable == false) {
            printf("%-8s  %-s  %s\n","sha1",(string *)uuidv5_namespace,
                   tensor_layer_name._M_dataplus._M_p);
          }
          else {
            result_1._0_8_ = result_1 + 0x10;
            builtin_memcpy(result_1 + 0x10,"sha1",5);
            result_1[8] = '\x04';
            result_1[9] = '\0';
            result_1[10] = '\0';
            result_1[0xb] = '\0';
            result_1[0xc] = '\0';
            result_1[0xd] = '\0';
            result_1[0xe] = '\0';
            result_1[0xf] = '\0';
            hex_result._0_8_ = hex_result + 0x10;
            sVar33 = strlen((char *)uuidv5_namespace);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)hex_result,(string *)uuidv5_namespace,uuidv5_namespace + sVar33);
            hVar14 = manifest_verify(&params.manifest_file,(string *)result_1,(string *)hex_result,
                                     &tensor_layer_name);
            if ((char *)hex_result._0_8_ != hex_result + 0x10) {
              operator_delete((void *)hex_result._0_8_,
                              CONCAT17(uStack_551,
                                       CONCAT16(uStack_552,
                                                CONCAT24(uStack_554,stack0xfffffffffffffaa8))) + 1);
            }
            puVar32 = result_1 + 0x10;
            if ((uchar *)result_1._0_8_ != puVar32) {
              operator_delete((void *)result_1._0_8_,
                              CONCAT17(result_1[0x17],
                                       CONCAT16(result_1[0x16],
                                                CONCAT15(result_1[0x15],
                                                         CONCAT14(result_1[0x14],result_1._16_4_))))
                              + 1);
              puVar32 = extraout_RAX_00;
            }
            uVar23 = (undefined7)((ulong)puVar32 >> 8);
            if (hVar14 == HASH_MANIFEST_MISMATCH) {
              local_57c = (uint)CONCAT71(uVar23,1);
              local_56c = (uint)CONCAT71(uVar23,1);
              pcVar26 = "Mismatch";
            }
            else if (hVar14 == HASH_MANIFEST_OK) {
              local_57c = (uint)CONCAT71(uVar23,1);
              pcVar26 = "Ok";
            }
            else {
              pcVar26 = "?";
              if (hVar14 == HASH_MANIFEST_NOT_FOUND) {
                pcVar26 = "Not Found";
              }
            }
            printf("%-8s  %-s  %s  -  %s\n","sha1",(string *)uuidv5_namespace,
                   tensor_layer_name._M_dataplus._M_p,pcVar26);
          }
        }
        SHA1Update((SHA1_CTX *)&arg_prefix,local_578,(uint32_t)local_588);
      }
      if (params.sha256 == true) {
        if (params.no_layer == false) {
          pbVar31 = result_1;
          sha256_hash(pbVar31,local_578,(size_t)local_588);
          local_488 = 0;
          uStack_480 = 0;
          uStack_497 = 0;
          uStack_493 = 0;
          uStack_48f = 0;
          local_4a8._0_8_ = 0;
          local_4a8[8] = '\0';
          local_4a8._9_4_ = 0;
          local_4a8._13_4_ = 0;
          uuidv5_namespace[0] = '\0';
          uuidv5_namespace[1] = '\0';
          uuidv5_namespace[2] = '\0';
          uuidv5_namespace[3] = '\0';
          uuidv5_namespace[4] = '\0';
          uuidv5_namespace[5] = '\0';
          uuidv5_namespace[6] = '\0';
          uuidv5_namespace[7] = '\0';
          uuidv5_namespace[8] = '\0';
          uuidv5_namespace[9] = '\0';
          uuidv5_namespace[10] = '\0';
          uuidv5_namespace[0xb] = '\0';
          uuidv5_namespace[0xc] = '\0';
          uuidv5_namespace[0xd] = '\0';
          uuidv5_namespace[0xe] = '\0';
          uuidv5_namespace[0xf] = '\0';
          local_478 = 0;
          sVar33 = 0x41;
          psVar27 = (string *)uuidv5_namespace;
          do {
            snprintf((char *)psVar27,sVar33,"%02x",(ulong)*pbVar31);
            sVar33 = sVar33 - 2;
            pbVar31 = pbVar31 + 1;
            psVar27 = (string *)((long)&(psVar27->_M_dataplus)._M_p + 2);
          } while (sVar33 != 1);
          if (params.manifest_is_usable == false) {
            printf("%-8s  %-s  %s\n","sha256",(string *)uuidv5_namespace,
                   tensor_layer_name._M_dataplus._M_p);
          }
          else {
            hex_result._0_8_ = hex_result + 0x10;
            uStack_554 = 0x3635;
            stack0xfffffffffffffaa8 = 0x32616873;
            hex_result[8] = '\x06';
            hex_result[9] = '\0';
            hex_result[10] = '\0';
            hex_result[0xb] = '\0';
            hex_result[0xc] = '\0';
            hex_result[0xd] = '\0';
            hex_result[0xe] = '\0';
            hex_result[0xf] = '\0';
            uStack_552 = '\0';
            result._0_8_ = result + 0x10;
            sVar33 = strlen((char *)uuidv5_namespace);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)result,(string *)uuidv5_namespace,uuidv5_namespace + sVar33);
            hVar14 = manifest_verify(&params.manifest_file,(string *)hex_result,(string *)result,
                                     &tensor_layer_name);
            if ((char *)result._0_8_ != result + 0x10) {
              operator_delete((void *)result._0_8_,stack0xfffffffffffffbc8 + 1);
            }
            pcVar26 = hex_result + 0x10;
            if ((char *)hex_result._0_8_ != pcVar26) {
              operator_delete((void *)hex_result._0_8_,
                              CONCAT17(uStack_551,(uint7)CONCAT24(0x3635,stack0xfffffffffffffaa8)) +
                              1);
              pcVar26 = extraout_RAX_01;
            }
            uVar23 = (undefined7)((ulong)pcVar26 >> 8);
            if (hVar14 == HASH_MANIFEST_MISMATCH) {
              local_57c = (uint)CONCAT71(uVar23,1);
              local_56c = (uint)CONCAT71(uVar23,1);
              pcVar26 = "Mismatch";
            }
            else if (hVar14 == HASH_MANIFEST_OK) {
              local_57c = (uint)CONCAT71(uVar23,1);
              pcVar26 = "Ok";
            }
            else {
              pcVar26 = "?";
              if (hVar14 == HASH_MANIFEST_NOT_FOUND) {
                pcVar26 = "Not Found";
              }
            }
            printf("%-8s  %-s  %s  -  %s\n","sha256",(string *)uuidv5_namespace,
                   tensor_layer_name._M_dataplus._M_p,pcVar26);
          }
        }
        sha256_update((sha256_t *)&arg,local_578,(size_t)local_588);
      }
      if (params.uuid == true) {
        SHA1Update((SHA1_CTX *)&manifest_entry_line,local_578,(uint32_t)local_588);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tensor_layer_name._M_dataplus._M_p != &tensor_layer_name.field_2) {
        operator_delete(tensor_layer_name._M_dataplus._M_p,
                        tensor_layer_name.field_2._M_allocated_capacity + 1);
      }
      uVar30 = local_450 + 1;
    } while (uVar30 != (uVar13 & 0x7fffffff));
  }
  uVar13 = local_56c;
  local_578 = (uchar *)((ulong)local_578 & 0xffffffff00000000);
  local_588 = (uchar *)((ulong)local_588 & 0xffffffff00000000);
  if (params.xxh64 != false) {
    XVar20 = XXH64_digest(local_460);
    lVar18 = 0x38;
    sVar33 = 0x11;
    puVar32 = result_1;
    do {
      snprintf((char *)puVar32,sVar33,"%02x",XVar20 >> ((byte)lVar18 & 0x3f) & 0xff);
      lVar18 = lVar18 + -8;
      sVar33 = sVar33 - 2;
      puVar32 = puVar32 + 2;
    } while (lVar18 != -8);
    if (params.manifest_is_usable == false) {
      local_578 = (uchar *)((ulong)local_578 & 0xffffffff00000000);
      printf("%-8s  %-s  %s\n","xxh64",result_1,params.input._M_dataplus._M_p);
      local_588 = (uchar *)((ulong)local_588 & 0xffffffff00000000);
      uVar16 = local_468;
    }
    else {
      local_4a8._0_6_ = 0x3436687878;
      uuidv5_namespace[8] = '\x05';
      uuidv5_namespace[9] = '\0';
      uuidv5_namespace[10] = '\0';
      uuidv5_namespace[0xb] = '\0';
      uuidv5_namespace[0xc] = '\0';
      uuidv5_namespace[0xd] = '\0';
      uuidv5_namespace[0xe] = '\0';
      uuidv5_namespace[0xf] = '\0';
      tensor_layer_name._M_dataplus._M_p = (pointer)&tensor_layer_name.field_2;
      uuidv5_namespace._0_8_ = local_4a8;
      sVar33 = strlen((char *)result_1);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&tensor_layer_name,result_1,result_1 + sVar33);
      uVar16 = local_468;
      hVar14 = manifest_verify(&params.manifest_file,(string *)uuidv5_namespace,&tensor_layer_name,
                               &params.input);
      uVar30 = (ulong)hVar14;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tensor_layer_name._M_dataplus._M_p != &tensor_layer_name.field_2) {
        operator_delete(tensor_layer_name._M_dataplus._M_p,
                        tensor_layer_name.field_2._M_allocated_capacity + 1);
        uVar30 = extraout_RAX_02;
      }
      if ((undefined1 *)uuidv5_namespace._0_8_ != local_4a8) {
        operator_delete((void *)uuidv5_namespace._0_8_,local_4a8._0_8_ + 1);
        uVar30 = extraout_RAX_03;
      }
      uVar23 = (undefined7)(uVar30 >> 8);
      if (hVar14 == HASH_MANIFEST_MISMATCH) {
        pcVar26 = "Mismatch";
        local_588 = (uchar *)CONCAT44(local_588._4_4_,(int)CONCAT71(uVar23,1));
        local_578 = (uchar *)CONCAT44(local_578._4_4_,(int)CONCAT71(uVar23,1));
      }
      else {
        if (hVar14 == HASH_MANIFEST_OK) {
          pcVar26 = "Ok";
          local_588 = (uchar *)CONCAT44(local_588._4_4_,(int)CONCAT71(uVar23,1));
        }
        else {
          pcVar26 = "?";
          if (hVar14 == HASH_MANIFEST_NOT_FOUND) {
            pcVar26 = "Not Found";
          }
          local_588 = (uchar *)((ulong)local_588._4_4_ << 0x20);
        }
        local_578 = (uchar *)((ulong)local_578._4_4_ << 0x20);
      }
      printf("%-8s  %-s  %s  -  %s\n","xxh64",result_1,params.input._M_dataplus._M_p,pcVar26);
    }
  }
  if (params.sha1 == true) {
    pbVar31 = (byte *)hex_result;
    SHA1Final(pbVar31,(SHA1_CTX *)&arg_prefix);
    sVar33 = 0x29;
    puVar32 = uuidv5_namespace;
    do {
      snprintf((char *)puVar32,sVar33,"%02x",(ulong)*pbVar31);
      sVar33 = sVar33 - 2;
      pbVar31 = pbVar31 + 1;
      puVar32 = puVar32 + 2;
    } while (sVar33 != 1);
    if (params.manifest_is_usable == false) {
      printf("%-8s  %-s  %s\n","sha1",uuidv5_namespace,params.input._M_dataplus._M_p);
    }
    else {
      tensor_layer_name._M_string_length = 4;
      tensor_layer_name.field_2._M_allocated_capacity._0_5_ = 0x31616873;
      result_1._0_8_ = result_1 + 0x10;
      tensor_layer_name._M_dataplus._M_p = (pointer)&tensor_layer_name.field_2;
      sVar33 = strlen((char *)uuidv5_namespace);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)result_1,uuidv5_namespace,uuidv5_namespace + sVar33);
      hVar14 = manifest_verify(&params.manifest_file,&tensor_layer_name,(string *)result_1,
                               &params.input);
      uVar30 = (ulong)hVar14;
      if ((uchar *)result_1._0_8_ != result_1 + 0x10) {
        operator_delete((void *)result_1._0_8_,
                        CONCAT17(result_1[0x17],
                                 CONCAT16(result_1[0x16],
                                          CONCAT15(result_1[0x15],
                                                   CONCAT14(result_1[0x14],result_1._16_4_)))) + 1);
        uVar30 = extraout_RAX_04;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tensor_layer_name._M_dataplus._M_p != &tensor_layer_name.field_2) {
        operator_delete(tensor_layer_name._M_dataplus._M_p,
                        tensor_layer_name.field_2._M_allocated_capacity + 1);
        uVar30 = extraout_RAX_05;
      }
      uVar23 = (undefined7)(uVar30 >> 8);
      if (hVar14 == HASH_MANIFEST_MISMATCH) {
        pcVar26 = "Mismatch";
        local_588 = (uchar *)CONCAT44(local_588._4_4_,(int)CONCAT71(uVar23,1));
        local_578 = (uchar *)CONCAT44(local_578._4_4_,(int)CONCAT71(uVar23,1));
      }
      else if (hVar14 == HASH_MANIFEST_OK) {
        pcVar26 = "Ok";
        local_588 = (uchar *)CONCAT44(local_588._4_4_,(int)CONCAT71(uVar23,1));
      }
      else {
        pcVar26 = "?";
        if (hVar14 == HASH_MANIFEST_NOT_FOUND) {
          pcVar26 = "Not Found";
        }
      }
      printf("%-8s  %-s  %s  -  %s\n","sha1",uuidv5_namespace,params.input._M_dataplus._M_p,pcVar26)
      ;
    }
  }
  if (params.sha256 == true) {
    psVar27 = &tensor_layer_name;
    sha256_final((sha256_t *)&arg,(uchar *)psVar27);
    puVar32 = uuidv5_namespace;
    local_488 = 0;
    uStack_480 = 0;
    uStack_497 = 0;
    uStack_493 = 0;
    uStack_48f = 0;
    local_4a8._0_8_ = 0;
    local_4a8[8] = '\0';
    local_4a8._9_4_ = 0;
    local_4a8._13_4_ = 0;
    uuidv5_namespace[0] = '\0';
    uuidv5_namespace[1] = '\0';
    uuidv5_namespace[2] = '\0';
    uuidv5_namespace[3] = '\0';
    uuidv5_namespace[4] = '\0';
    uuidv5_namespace[5] = '\0';
    uuidv5_namespace[6] = '\0';
    uuidv5_namespace[7] = '\0';
    uuidv5_namespace[8] = '\0';
    uuidv5_namespace[9] = '\0';
    uuidv5_namespace[10] = '\0';
    uuidv5_namespace[0xb] = '\0';
    uuidv5_namespace[0xc] = '\0';
    uuidv5_namespace[0xd] = '\0';
    uuidv5_namespace[0xe] = '\0';
    uuidv5_namespace[0xf] = '\0';
    local_478 = 0;
    sVar33 = 0x41;
    do {
      snprintf((char *)puVar32,sVar33,"%02x",(ulong)*(byte *)&(psVar27->_M_dataplus)._M_p);
      sVar33 = sVar33 - 2;
      psVar27 = (string *)((long)&(psVar27->_M_dataplus)._M_p + 1);
      puVar32 = puVar32 + 2;
    } while (sVar33 != 1);
    if (params.manifest_is_usable == false) {
      printf("%-8s  %-s  %s\n","sha256",uuidv5_namespace,params.input._M_dataplus._M_p);
    }
    else {
      builtin_memcpy(result_1 + 0x10,"sha256",7);
      result_1[8] = '\x06';
      result_1[9] = '\0';
      result_1[10] = '\0';
      result_1[0xb] = '\0';
      result_1[0xc] = '\0';
      result_1[0xd] = '\0';
      result_1[0xe] = '\0';
      result_1[0xf] = '\0';
      hex_result._0_8_ = hex_result + 0x10;
      result_1._0_8_ = result_1 + 0x10;
      sVar33 = strlen((char *)uuidv5_namespace);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)hex_result,uuidv5_namespace,uuidv5_namespace + sVar33);
      hVar14 = manifest_verify(&params.manifest_file,(string *)result_1,(string *)hex_result,
                               &params.input);
      uVar30 = (ulong)hVar14;
      if ((char *)hex_result._0_8_ != hex_result + 0x10) {
        operator_delete((void *)hex_result._0_8_,
                        CONCAT17(uStack_551,
                                 CONCAT16(uStack_552,CONCAT24(uStack_554,stack0xfffffffffffffaa8)))
                        + 1);
        uVar30 = extraout_RAX_06;
      }
      if ((uchar *)result_1._0_8_ != result_1 + 0x10) {
        operator_delete((void *)result_1._0_8_,
                        CONCAT17(result_1[0x17],
                                 CONCAT16(result_1[0x16],
                                          CONCAT15(result_1[0x15],
                                                   CONCAT14(result_1[0x14],result_1._16_4_)))) + 1);
        uVar30 = extraout_RAX_07;
      }
      uVar23 = (undefined7)(uVar30 >> 8);
      if (hVar14 == HASH_MANIFEST_MISMATCH) {
        pcVar26 = "Mismatch";
        local_588 = (uchar *)CONCAT44(local_588._4_4_,(int)CONCAT71(uVar23,1));
        local_578 = (uchar *)CONCAT44(local_578._4_4_,(int)CONCAT71(uVar23,1));
      }
      else if (hVar14 == HASH_MANIFEST_OK) {
        pcVar26 = "Ok";
        local_588 = (uchar *)CONCAT44(local_588._4_4_,(int)CONCAT71(uVar23,1));
      }
      else {
        pcVar26 = "?";
        if (hVar14 == HASH_MANIFEST_NOT_FOUND) {
          pcVar26 = "Not Found";
        }
      }
      printf("%-8s  %-s  %s  -  %s\n","sha256",uuidv5_namespace,params.input._M_dataplus._M_p,
             pcVar26);
    }
  }
  if (params.uuid == true) {
    SHA1Final((uchar *)hex_result,(SHA1_CTX *)&manifest_entry_line);
    local_450 = (ulong)hex_result._0_8_ >> 0x18 & 0xff;
    local_460 = (XXH64_state_t *)((ulong)hex_result._0_8_ >> 0x28 & 0xff);
    local_4a8._0_8_ = 0;
    local_4a8[8] = '\0';
    local_4a8._9_4_ = 0;
    uuidv5_namespace[0] = '\0';
    uuidv5_namespace[1] = '\0';
    uuidv5_namespace[2] = '\0';
    uuidv5_namespace[3] = '\0';
    uuidv5_namespace[4] = '\0';
    uuidv5_namespace[5] = '\0';
    uuidv5_namespace[6] = '\0';
    uuidv5_namespace[7] = '\0';
    uuidv5_namespace[8] = '\0';
    uuidv5_namespace[9] = '\0';
    uuidv5_namespace[10] = '\0';
    uuidv5_namespace[0xb] = '\0';
    uuidv5_namespace[0xc] = '\0';
    uuidv5_namespace[0xd] = '\0';
    uuidv5_namespace[0xe] = '\0';
    uuidv5_namespace[0xf] = '\0';
    local_4a8._13_4_ = 0;
    uStack_497 = 0;
    snprintf((char *)uuidv5_namespace,0x25,
             "%02x%02x%02x%02x-%02x%02x-%02x%02x-%02x%02x-%02x%02x%02x%02x%02x%02x",
             hex_result._0_8_ & 0xff,(ulong)hex_result._0_8_ >> 8 & 0xff,
             (ulong)hex_result._0_8_ >> 0x10 & 0xff,local_450,(ulong)hex_result._0_8_ >> 0x20 & 0xff
             ,local_460,(ulong)((byte)hex_result[6] & 0xf | 0x50),(ulong)hex_result._0_8_ >> 0x38,
             (ulong)((byte)hex_result[8] & 0x3f | 0x80),(ulong)hex_result._8_8_ >> 8 & 0xff,
             (ulong)hex_result._8_8_ >> 0x10 & 0xff,(ulong)hex_result._8_8_ >> 0x18 & 0xff,
             (ulong)hex_result._8_8_ >> 0x20 & 0xff,(ulong)hex_result._8_8_ >> 0x28 & 0xff,
             (ulong)hex_result._8_8_ >> 0x30 & 0xff,(ulong)hex_result._8_8_ >> 0x38);
    if (params.manifest_is_usable == true) {
      tensor_layer_name._M_string_length = 6;
      tensor_layer_name.field_2._M_allocated_capacity._0_7_ = 0x363532616873;
      result_1._0_8_ = result_1 + 0x10;
      tensor_layer_name._M_dataplus._M_p = (pointer)&tensor_layer_name.field_2;
      sVar33 = strlen((char *)uuidv5_namespace);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)result_1,uuidv5_namespace,uuidv5_namespace + sVar33);
      hVar14 = manifest_verify(&params.manifest_file,&tensor_layer_name,(string *)result_1,
                               &params.input);
      uVar16 = local_468;
      uVar13 = local_56c;
      uVar30 = (ulong)hVar14;
      if ((uchar *)result_1._0_8_ != result_1 + 0x10) {
        operator_delete((void *)result_1._0_8_,
                        CONCAT17(result_1[0x17],
                                 CONCAT16(result_1[0x16],
                                          CONCAT15(result_1[0x15],
                                                   CONCAT14(result_1[0x14],result_1._16_4_)))) + 1);
        uVar30 = extraout_RAX_08;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tensor_layer_name._M_dataplus._M_p != &tensor_layer_name.field_2) {
        operator_delete(tensor_layer_name._M_dataplus._M_p,
                        tensor_layer_name.field_2._M_allocated_capacity + 1);
        uVar30 = extraout_RAX_09;
      }
      uVar23 = (undefined7)(uVar30 >> 8);
      if (hVar14 == HASH_MANIFEST_MISMATCH) {
        pcVar26 = "Mismatch";
        local_588 = (uchar *)CONCAT44(local_588._4_4_,(int)CONCAT71(uVar23,1));
        local_578 = (uchar *)CONCAT44(local_578._4_4_,(int)CONCAT71(uVar23,1));
      }
      else if (hVar14 == HASH_MANIFEST_OK) {
        pcVar26 = "Ok";
        local_588 = (uchar *)CONCAT44(local_588._4_4_,(int)CONCAT71(uVar23,1));
      }
      else {
        pcVar26 = "?";
        if (hVar14 == HASH_MANIFEST_NOT_FOUND) {
          pcVar26 = "Not Found";
        }
      }
      printf("%-8s  %-s  %s  -  %s\n","uuid",uuidv5_namespace,params.input._M_dataplus._M_p,pcVar26)
      ;
    }
    else {
      printf("%-8s  %-s  %s\n","uuid",uuidv5_namespace,params.input._M_dataplus._M_p);
      uVar16 = local_468;
      uVar13 = local_56c;
    }
  }
  ggml_free(ctx_data);
  gguf_free(uVar16);
  if (params.manifest_is_usable != true) {
    uVar13 = 0;
    goto LAB_00103b69;
  }
  if ((char)local_588 == '\0') {
    uVar29 = uVar13;
    if ((local_57c & 1) != 0) goto LAB_00103b39;
    pcVar26 = "Manifest Missing Entry";
    uVar13 = 3;
  }
  else {
    uVar29 = (uint)local_578;
    if (((local_57c & 1) == 0) || ((uVar13 & 1) == 0)) {
LAB_00103b39:
      uVar13 = (uint)((byte)uVar29 & 1);
      pcVar26 = "Failure";
      if ((uVar29 & 1) == 0) {
        pcVar26 = "Success";
      }
    }
    else {
      pcVar26 = "Failure";
      uVar13 = 1;
    }
  }
  printf("\nVerification results for %s - %s\n",params.manifest_file._M_dataplus._M_p,pcVar26);
LAB_00103b69:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)params.manifest_file._M_dataplus._M_p != &params.manifest_file.field_2) {
    operator_delete(params.manifest_file._M_dataplus._M_p,
                    CONCAT71(params.manifest_file.field_2._M_allocated_capacity._1_7_,
                             params.manifest_file.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)params.input._M_dataplus._M_p != &params.input.field_2) {
    operator_delete(params.input._M_dataplus._M_p,
                    CONCAT71(params.input.field_2._M_allocated_capacity._1_7_,
                             params.input.field_2._M_local_buf[0]) + 1);
  }
  return uVar13;
}

Assistant:

int main(int argc, const char ** argv) {
    hash_params params;
    manifest_check_params manifest_check;
    hash_params_parse(argc, argv, params);

    if (!params.manifest_file.empty()) {
        if (!manifest_type(params.manifest_file, manifest_check)) {
            printf("ERROR cannot open manifest %s", params.manifest_file.c_str());
            return HASH_EXIT_MANIFEST_FILE_ERROR;
        }

        if (!manifest_check.sha256 && !manifest_check.sha1 && !manifest_check.xxh64 && !manifest_check.uuid) {
            printf("ERROR manifest does not have any known hash format in %s", params.manifest_file.c_str());
            return HASH_EXIT_MANIFEST_UNKNOWN_HASH;
        }

        printf("manifest  %s", params.manifest_file.c_str());

        if (manifest_check.sha256) {
            printf("  sha256");
        }

        if (manifest_check.sha1) {
            printf("  sha1");
        }

        if (manifest_check.xxh64) {
            printf("  xxh64");
        }

        if (manifest_check.uuid) {
            printf("  uuid");
        }

        printf("\n");

        // Autoselect the highest security hash if manifest is provided but
        // the user has not specifically defined the hash they care about
        if (!params.xxh64 && !params.sha1 && !params.uuid && !params.sha256) {
            // User has not selected a specific value, pick most secure hash
            if (manifest_check.sha256) {
                params.sha256 = true;
            } else if (manifest_check.sha1) {
                params.sha1 = true;
            } else if (manifest_check.xxh64) {
                params.xxh64 = true;
            } else if (manifest_check.uuid) {
                params.uuid = true;
            }
        }

        params.manifest_is_usable = true;
    }

    // By default if no swich argument provided, assume xxh64
    if (!params.xxh64 && !params.sha1 && !params.uuid && !params.sha256) {
        params.xxh64 = true;
    }

    hash_exit_code_t exit_code = gguf_hash(params);

    if (params.manifest_is_usable) {
        printf("\nVerification results for %s - %s\n", params.manifest_file.c_str(), hash_exit_code_to_str(exit_code));
    }

    return exit_code;
}